

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

int main(void)

{
  _Bool _Var1;
  fnet_socket_t sock;
  size_t read_len;
  fnet_address_t addr;
  char cli_addr [128];
  fnet_address_t srv_addr;
  char buf [65536];
  size_t sStack_101b0;
  fnet_address_t fStack_101a8;
  char acStack_10128 [128];
  fnet_address_t fStack_100a8;
  char acStack_10028 [65544];
  
  fnet_socket_init();
  fnet_str2addr("127.0.0.1:10500",&fStack_100a8);
  sock = fnet_socket_bind(FNET_SOCK_DGRAM,&fStack_100a8);
  sStack_101b0 = 0;
  _Var1 = fnet_socket_recvfrom(sock,acStack_10028,0x10000,&sStack_101b0,&fStack_101a8);
  if (_Var1) {
    acStack_10028[sStack_101b0 - 1] = '\0';
    fnet_addr2str(&fStack_101a8,acStack_10128,0x80);
    printf("Got: %s, from %s\n",acStack_10028,acStack_10128);
    fnet_socket_sendto(sock,acStack_10028,sStack_101b0,&fStack_101a8);
  }
  fnet_socket_close(sock);
  fnet_socket_uninit();
  return 0;
}

Assistant:

int main()
{
    fnet_socket_init();

    fnet_address_t srv_addr;
    fnet_str2addr("127.0.0.1:10500", &srv_addr);
    fnet_socket_t srv = fnet_socket_bind(FNET_SOCK_DGRAM, &srv_addr);

    char buf[65536];
    size_t read_len = 0;
    fnet_address_t addr;
    
    if (fnet_socket_recvfrom(srv, buf, sizeof buf, &read_len, &addr))
    {
        buf[read_len - 1] = 0;
        
        char cli_addr[128];
        fnet_addr2str(&addr, cli_addr, sizeof cli_addr);
        printf("Got: %s, from %s\n", buf, cli_addr);

        fnet_socket_sendto(srv, buf, read_len, &addr);
    }

    fnet_socket_close(srv);
    fnet_socket_uninit();
    return 0;
}